

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_job_queue_next(ma_job_queue *pQueue,ma_job *pJob)

{
  ma_spinlock mVar1;
  ulong slot;
  ulong uVar2;
  ulong uVar3;
  ma_result mVar4;
  long lVar5;
  ma_job *pmVar6;
  ma_job *pmVar7;
  bool bVar8;
  byte bVar9;
  
  bVar9 = 0;
  mVar4 = MA_INVALID_ARGS;
  if (pJob != (ma_job *)0x0 && pQueue != (ma_job_queue *)0x0) {
    if ((pQueue->flags & 1) == 0) {
      ma_semaphore_wait(&pQueue->sem);
    }
    while( true ) {
      LOCK();
      mVar1 = pQueue->lock;
      pQueue->lock = 1;
      UNLOCK();
      if (mVar1 == 0) break;
      do {
      } while (pQueue->lock == 1);
    }
    do {
      while( true ) {
        do {
          slot = pQueue->head;
          uVar2 = pQueue->tail;
          uVar3 = pQueue->pJobs[slot & 0xffff].next;
        } while (((pQueue->head ^ slot) & 0xffffffff0000ffff) != 0);
        if ((short)slot != (short)uVar2) break;
        if ((short)uVar3 == -1) {
          pQueue->lock = 0;
          return MA_NO_DATA_AVAILABLE;
        }
        LOCK();
        if (uVar2 == pQueue->tail) {
          pQueue->tail = (uVar2 & 0xffffffff00000000) + 0x100000000 | uVar3 & 0xffff;
        }
        UNLOCK();
      }
      pmVar6 = pQueue->pJobs + (uVar3 & 0xffff);
      pmVar7 = pJob;
      for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
        pmVar7->toc = pmVar6->toc;
        pmVar6 = (ma_job *)((long)pmVar6 + (ulong)bVar9 * -0x10 + 8);
        pmVar7 = (ma_job *)((long)pmVar7 + (ulong)bVar9 * -0x10 + 8);
      }
      LOCK();
      bVar8 = slot == pQueue->head;
      if (bVar8) {
        pQueue->head = (slot & 0xffffffff00000000) + 0x100000000 | uVar3 & 0xffff;
      }
      UNLOCK();
    } while (!bVar8);
    pQueue->lock = 0;
    ma_slot_allocator_free(&pQueue->allocator,slot);
    mVar4 = MA_SUCCESS;
    if ((pJob->toc).breakup.code == 0) {
      ma_job_queue_post(pQueue,pJob);
      mVar4 = MA_CANCELLED;
    }
  }
  return mVar4;
}

Assistant:

MA_API ma_result ma_job_queue_next(ma_job_queue* pQueue, ma_job* pJob)
{
    ma_uint64 head;
    ma_uint64 tail;
    ma_uint64 next;

    if (pQueue == NULL || pJob == NULL) {
        return MA_INVALID_ARGS;
    }

    /* If we're running in synchronous mode we'll need to wait on a semaphore. */
    if ((pQueue->flags & MA_JOB_QUEUE_FLAG_NON_BLOCKING) == 0) {
        #ifndef MA_NO_THREADING
        {
            ma_semaphore_wait(&pQueue->sem);
        }
        #else
        {
            MA_ASSERT(MA_FALSE);    /* Should never get here. Should have been checked at initialization time. */
        }
        #endif
    }

    #ifndef MA_USE_EXPERIMENTAL_LOCK_FREE_JOB_QUEUE
    ma_spinlock_lock(&pQueue->lock);
    #endif
    {
        /*
        BUG: In lock-free mode, multiple threads can be in this section of code. The "head" variable in the loop below
        is stored. One thread can fall through to the freeing of this item while another is still using "head" for the
        retrieval of the "next" variable.

        The slot allocator might need to make use of some reference counting to ensure it's only truely freed when
        there are no more references to the item. This must be fixed before removing these locks.
        */

        /* Now we need to remove the root item from the list. */
        for (;;) {
            head = c89atomic_load_64(&pQueue->head);
            tail = c89atomic_load_64(&pQueue->tail);
            next = c89atomic_load_64(&pQueue->pJobs[ma_job_extract_slot(head)].next);

            if (ma_job_toc_to_allocation(head) == ma_job_toc_to_allocation(c89atomic_load_64(&pQueue->head))) {
                if (ma_job_extract_slot(head) == ma_job_extract_slot(tail)) {
                    if (ma_job_extract_slot(next) == 0xFFFF) {
                        #ifndef MA_USE_EXPERIMENTAL_LOCK_FREE_JOB_QUEUE
                        ma_spinlock_unlock(&pQueue->lock);
                        #endif
                        return MA_NO_DATA_AVAILABLE;
                    }
                    ma_job_queue_cas(&pQueue->tail, tail, ma_job_extract_slot(next));
                } else {
                    *pJob = pQueue->pJobs[ma_job_extract_slot(next)];
                    if (ma_job_queue_cas(&pQueue->head, head, ma_job_extract_slot(next))) {
                        break;
                    }
                }
            }
        }
    }
    #ifndef MA_USE_EXPERIMENTAL_LOCK_FREE_JOB_QUEUE
    ma_spinlock_unlock(&pQueue->lock);
    #endif

    ma_slot_allocator_free(&pQueue->allocator, head);

    /*
    If it's a quit job make sure it's put back on the queue to ensure other threads have an opportunity to detect it and terminate naturally. We
    could instead just leave it on the queue, but that would involve fiddling with the lock-free code above and I want to keep that as simple as
    possible.
    */
    if (pJob->toc.breakup.code == MA_JOB_TYPE_QUIT) {
        ma_job_queue_post(pQueue, pJob);
        return MA_CANCELLED;    /* Return a cancelled status just in case the thread is checking return codes and not properly checking for a quit job. */
    }

    return MA_SUCCESS;
}